

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O1

uint64_t farmhash64_xo(char *s,size_t len)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  uint64_t uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  
  if (len < 0x21) {
    if (len < 0x11) {
      if (len < 8) {
        if (len < 4) {
          if (len == 0) {
            return 0x9ae16a3b2f90404f;
          }
          uVar7 = ((ulong)(byte)s[len - 1] << 2 | len) * -0x3c5a37a36834ced9 ^
                  (ulong)CONCAT11(s[len >> 1],*s) * -0x651e95c4d06fbfb1;
          return (uVar7 >> 0x2f ^ uVar7) * -0x651e95c4d06fbfb1;
        }
        lVar6 = len * 2 + -0x651e95c4d06fbfb1;
        uVar7 = (len + (ulong)*(uint *)s * 8 ^ (ulong)*(uint *)(s + (len - 4))) * lVar6;
        uVar7 = (uVar7 >> 0x2f ^ *(uint *)(s + (len - 4)) ^ uVar7) * lVar6;
        uVar7 = uVar7 >> 0x2f ^ uVar7;
      }
      else {
        lVar6 = len * 2 + -0x651e95c4d06fbfb1;
        uVar1 = *(long *)s + 0x9ae16a3b2f90404f;
        uVar7 = *(ulong *)(s + (len - 8));
        uVar2 = ((uVar1 >> 0x19 | uVar1 << 0x27) + uVar7) * lVar6;
        uVar7 = ((uVar7 >> 0x25 | uVar7 << 0x1b) * lVar6 + uVar1 ^ uVar2) * lVar6;
        uVar7 = (uVar7 >> 0x2f ^ uVar2 ^ uVar7) * lVar6;
        uVar7 = uVar7 >> 0x2f ^ uVar7;
      }
    }
    else {
      lVar6 = len * 2 + -0x651e95c4d06fbfb1;
      uVar2 = *(long *)(s + (len - 8)) * lVar6;
      uVar7 = *(long *)s * -0x4b6d499041670d8d + *(long *)(s + 8);
      uVar1 = *(long *)(s + 8) + 0x9ae16a3b2f90404f;
      uVar1 = (uVar1 >> 0x12 | uVar1 << 0x2e) + *(long *)s * -0x4b6d499041670d8d + uVar2;
      uVar7 = ((uVar2 >> 0x1e | uVar2 << 0x22) + (uVar7 >> 0x2b | uVar7 * 0x200000) +
               *(long *)(s + (len - 0x10)) * -0x651e95c4d06fbfb1 ^ uVar1) * lVar6;
      uVar7 = (uVar7 >> 0x2f ^ uVar1 ^ uVar7) * lVar6;
      uVar7 = uVar7 >> 0x2f ^ uVar7;
    }
  }
  else {
    if (0x40 < len) {
      if (len < 0x61) {
        lVar6 = len * 2 + -0x651e95c4d06fc023;
        uVar1 = *(long *)(s + 0x18) * -0x651e95c4d06fc023;
        uVar7 = *(long *)s * -0x4b6d499041670d8d + *(long *)(s + 8);
        uVar2 = *(long *)(s + 8) + 0x9ae16a3b2f90404f;
        uVar2 = (uVar2 >> 0x12 | uVar2 << 0x2e) + *(long *)s * -0x4b6d499041670d8d + uVar1;
        uVar7 = ((uVar1 >> 0x1e | uVar1 << 0x22) + (uVar7 >> 0x2b | uVar7 * 0x200000) +
                 *(long *)(s + 0x10) * -0x651e95c4d06fbfb1 ^ uVar2) * -0x651e95c4d06fc023;
        uVar2 = (uVar7 >> 0x2f ^ uVar2 ^ uVar7) * -0x651e95c4d06fc023;
        uVar13 = *(long *)(s + 0x38) * lVar6;
        uVar7 = *(long *)(s + 0x20) * -0x4b6d499041670d8d + *(long *)(s + 0x28);
        uVar1 = *(long *)(s + 0x28) + 0x9ae16a3b2f90404f;
        uVar1 = (uVar1 >> 0x12 | uVar1 << 0x2e) + *(long *)(s + 0x20) * -0x4b6d499041670d8d + uVar13
        ;
        uVar7 = ((uVar13 >> 0x1e | uVar13 << 0x22) + (uVar7 >> 0x2b | uVar7 * 0x200000) +
                 *(long *)(s + 0x30) * -0x651e95c4d06fbfb1 ^ uVar1) * lVar6;
        uVar1 = (uVar7 >> 0x2f ^ uVar1 ^ uVar7) * lVar6;
        uVar14 = *(long *)(s + (len - 8)) * lVar6;
        uVar7 = *(long *)(s + (len - 0x20)) * -0x4b6d499041670d8d + *(long *)(s + (len - 0x18));
        uVar13 = *(long *)(s + (len - 0x18)) + 0x9ae16a3b2f90404f;
        uVar13 = (uVar13 >> 0x12 | uVar13 << 0x2e) +
                 *(long *)(s + (len - 0x20)) * -0x4b6d499041670d8d + uVar14 +
                 (uVar1 >> 0x2f ^ uVar1);
        uVar7 = ((uVar14 >> 0x1e | uVar14 << 0x22) + (uVar7 >> 0x2b | uVar7 * 0x200000) +
                 *(long *)(s + (len - 0x10)) * -0x651e95c4d06fbfb1 + (uVar2 >> 0x2f ^ uVar2) ^
                uVar13) * lVar6;
        uVar7 = (uVar7 >> 0x2f ^ uVar13 ^ uVar7) * lVar6;
        return ((uVar1 >> 0x15) + (uVar2 >> 0x11) + (uVar7 >> 0x2f ^ uVar7) * 9) * lVar6;
      }
      if (len < 0x101) {
        if (0x20 < len) {
          if (len < 0x41) {
            lVar6 = len * 2 + -0x651e95c4d06fbfb1;
            lVar3 = *(long *)s * -0x651e95c4d06fbfb1;
            uVar1 = *(long *)(s + (len - 8)) * lVar6;
            uVar7 = lVar3 + *(long *)(s + 8);
            uVar7 = (uVar1 >> 0x1e | uVar1 << 0x22) + (uVar7 >> 0x2b | uVar7 * 0x200000) +
                    *(long *)(s + (len - 0x10)) * -0x651e95c4d06fbfb1;
            uVar2 = *(long *)(s + 8) + 0x9ae16a3b2f90404f;
            uVar1 = (uVar2 >> 0x12 | uVar2 << 0x2e) + lVar3 + uVar1;
            uVar2 = (uVar7 ^ uVar1) * lVar6;
            uVar13 = (uVar2 >> 0x2f ^ uVar1 ^ uVar2) * lVar6;
            uVar2 = (uVar7 + *(long *)(s + (len - 0x20))) * lVar6;
            uVar7 = *(long *)(s + 0x10) * lVar6 + *(long *)(s + 0x18);
            uVar1 = lVar3 + *(long *)(s + 0x18);
            uVar1 = (uVar1 >> 0x12 | uVar1 << 0x2e) + *(long *)(s + 0x10) * lVar6 + uVar2;
            uVar7 = ((uVar2 >> 0x1e | uVar2 << 0x22) + (uVar7 >> 0x2b | uVar7 * 0x200000) +
                     ((uVar13 >> 0x2f ^ uVar13) * lVar6 + *(long *)(s + (len - 0x18))) * lVar6 ^
                    uVar1) * lVar6;
            uVar7 = (uVar7 >> 0x2f ^ uVar1 ^ uVar7) * lVar6;
            uVar4 = (uVar7 >> 0x2f ^ uVar7) * lVar6;
          }
          else {
            lVar8 = *(long *)s + 0x1529cba0ca458ff;
            uVar7 = len - 1 & 0xffffffffffffffc0;
            uVar13 = (ulong)((uint)(len - 1) & 0x3f);
            lVar10 = 0x226bb95b4e64b6d4;
            uVar2 = 0x134a747f856d0526;
            uVar14 = 0;
            lVar3 = 0;
            uVar1 = 0;
            lVar15 = 0;
            lVar6 = 0;
            do {
              uVar9 = lVar8 + lVar15 + lVar10 + *(long *)(s + uVar14 + 8);
              uVar11 = lVar10 + lVar6 + *(long *)(s + uVar14 + 0x30);
              lVar10 = lVar15 + *(long *)(s + uVar14 + 0x28) +
                       (uVar11 >> 0x2a | uVar11 * 0x400000) * -0x4b6d499041670d8d;
              uVar12 = uVar2 + lVar3;
              lVar6 = lVar6 * -0x4b6d499041670d8d + *(long *)(s + uVar14);
              uVar11 = *(long *)(s + uVar14 + 8) + lVar6 + *(long *)(s + uVar14 + 0x10);
              lVar15 = uVar11 + *(long *)(s + uVar14 + 0x18);
              uVar2 = (uVar9 >> 0x25 | uVar9 * 0x8000000) * -0x4b6d499041670d8d ^ uVar1;
              lVar8 = (uVar12 >> 0x21 | uVar12 * 0x80000000) * -0x4b6d499041670d8d;
              uVar9 = lVar3 + lVar6 + *(long *)(s + uVar14 + 0x18) + uVar2;
              lVar6 = lVar6 + (uVar11 >> 0x2c | uVar11 * 0x100000) + (uVar9 >> 0x15 | uVar9 << 0x2b)
              ;
              lVar5 = uVar1 + lVar8 + *(long *)(s + uVar14 + 0x20);
              uVar11 = *(long *)(s + uVar14 + 0x10) + lVar5 + lVar10 + *(long *)(s + uVar14 + 0x38);
              uVar1 = *(long *)(s + uVar14 + 0x28) + *(long *)(s + uVar14 + 0x30) + lVar5;
              lVar3 = uVar1 + *(long *)(s + uVar14 + 0x38);
              uVar1 = lVar5 + (uVar1 >> 0x2c | uVar1 * 0x100000) + (uVar11 >> 0x15 | uVar11 << 0x2b)
              ;
              uVar14 = uVar14 + 0x40;
            } while (uVar7 != uVar14);
            lVar5 = (uVar2 & 0xff) * 2 + -0x4b6d499041670d8d;
            lVar15 = lVar15 + lVar3 + uVar13;
            lVar3 = lVar3 + uVar13 + lVar15;
            uVar14 = lVar8 + lVar10 + *(long *)(s + uVar13 + (uVar7 - 0x37)) + lVar15;
            uVar9 = lVar10 + lVar6 + *(long *)(s + uVar13 + (uVar7 - 0xf));
            uVar11 = uVar1 * 9 ^ (uVar14 >> 0x25 | uVar14 * 0x8000000) * lVar5;
            uVar9 = lVar15 * 9 + *(long *)(s + uVar13 + (uVar7 - 0x17)) +
                    (uVar9 >> 0x2a | uVar9 * 0x400000) * lVar5;
            uVar2 = uVar2 + lVar3;
            lVar6 = lVar6 * lVar5 + *(long *)(s + uVar13 + (uVar7 - 0x3f));
            uVar14 = lVar3 + lVar6 + uVar11 + *(long *)(s + uVar13 + (uVar7 - 0x27));
            uVar12 = *(long *)(s + uVar13 + (uVar7 - 0x37)) + *(long *)(s + uVar13 + (uVar7 - 0x2f))
                     + lVar6;
            uVar2 = uVar2 >> 0x21 | uVar2 * 0x80000000;
            lVar3 = uVar2 * lVar5 + uVar1 + *(long *)(s + uVar13 + (uVar7 - 0x1f));
            uVar16 = *(long *)(s + uVar13 + (uVar7 - 0x17)) + *(long *)(s + uVar13 + (uVar7 - 0xf))
                     + lVar3;
            uVar17 = uVar16 + *(long *)(s + uVar13 + (uVar7 - 7));
            uVar1 = *(long *)(s + uVar13 + (uVar7 - 0x2f)) + uVar9 +
                    *(long *)(s + uVar13 + (uVar7 - 7)) + lVar3;
            uVar1 = (uVar16 >> 0x2c | uVar16 * 0x100000) + lVar3 + (uVar1 >> 0x15 | uVar1 << 0x2b);
            uVar7 = (uVar12 + *(long *)(s + uVar13 + (uVar7 - 0x27)) ^ uVar17) * lVar5;
            uVar7 = (uVar7 >> 0x2f ^ uVar17 ^ uVar7) * lVar5;
            uVar7 = ((uVar12 >> 0x2c | uVar12 * 0x100000) + lVar6 +
                     (uVar14 >> 0x15 | uVar14 << 0x2b) ^ uVar1) * lVar5;
            uVar7 = (uVar7 >> 0x2f ^ uVar1 ^ uVar7) * lVar5;
            uVar7 = ((uVar7 >> 0x2f ^ uVar7) + uVar2) * lVar5;
            uVar7 = ((uVar9 >> 0x2f ^ uVar9) * -0x3c5a37a36834ced9 + uVar11 +
                     (uVar7 >> 0x2f ^ uVar7) * lVar5 ^ uVar7) * lVar5;
            uVar7 = (uVar7 >> 0x2f ^ uVar7 ^ uVar7) * lVar5;
            uVar4 = (uVar7 >> 0x2f ^ uVar7) * lVar5;
          }
          return uVar4;
        }
        if (len < 0x11) {
          if (len < 8) {
            if (len < 4) {
              if (len == 0) {
                return 0x9ae16a3b2f90404f;
              }
              uVar7 = ((ulong)(byte)s[len - 1] << 2 | len) * -0x3c5a37a36834ced9 ^
                      (ulong)CONCAT11(s[len >> 1],*s) * -0x651e95c4d06fbfb1;
              return (uVar7 >> 0x2f ^ uVar7) * -0x651e95c4d06fbfb1;
            }
            lVar6 = len * 2 + -0x651e95c4d06fbfb1;
            uVar7 = (len + (ulong)*(uint *)s * 8 ^ (ulong)*(uint *)(s + (len - 4))) * lVar6;
            uVar7 = (uVar7 >> 0x2f ^ *(uint *)(s + (len - 4)) ^ uVar7) * lVar6;
            uVar7 = uVar7 >> 0x2f ^ uVar7;
          }
          else {
            lVar6 = len * 2 + -0x651e95c4d06fbfb1;
            uVar1 = *(long *)s + 0x9ae16a3b2f90404f;
            uVar7 = *(ulong *)(s + (len - 8));
            uVar2 = ((uVar1 >> 0x19 | uVar1 << 0x27) + uVar7) * lVar6;
            uVar7 = ((uVar7 >> 0x25 | uVar7 << 0x1b) * lVar6 + uVar1 ^ uVar2) * lVar6;
            uVar7 = (uVar7 >> 0x2f ^ uVar2 ^ uVar7) * lVar6;
            uVar7 = uVar7 >> 0x2f ^ uVar7;
          }
        }
        else {
          lVar6 = len * 2 + -0x651e95c4d06fbfb1;
          uVar2 = *(long *)(s + (len - 8)) * lVar6;
          uVar7 = *(long *)s * -0x4b6d499041670d8d + *(long *)(s + 8);
          uVar1 = *(long *)(s + 8) + 0x9ae16a3b2f90404f;
          uVar1 = (uVar1 >> 0x12 | uVar1 << 0x2e) + *(long *)s * -0x4b6d499041670d8d + uVar2;
          uVar7 = ((uVar2 >> 0x1e | uVar2 << 0x22) + (uVar7 >> 0x2b | uVar7 * 0x200000) +
                   *(long *)(s + (len - 0x10)) * -0x651e95c4d06fbfb1 ^ uVar1) * lVar6;
          uVar7 = (uVar7 >> 0x2f ^ uVar1 ^ uVar7) * lVar6;
          uVar7 = uVar7 >> 0x2f ^ uVar7;
        }
        return uVar7 * lVar6;
      }
      uVar4 = farmhash64_uo(s,len);
      return uVar4;
    }
    lVar6 = len * 2 + -0x651e95c4d06fbfcf;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = *(ulong *)(s + (len - 0x20));
    auVar24._8_8_ = 0;
    auVar24._0_8_ = *(ulong *)s;
    auVar22 = vpunpcklqdq_avx(auVar22,auVar24);
    auVar23._8_8_ = 0xb492b66fbe98f273;
    auVar23._0_8_ = 0xb492b66fbe98f273;
    auVar18 = vpmullq_avx512vl(auVar22,auVar23);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = *(ulong *)(s + (len - 8));
    auVar20._8_8_ = 0;
    auVar20._0_8_ = *(ulong *)(s + 0x18);
    auVar22 = vpunpcklqdq_avx(auVar19,auVar20);
    auVar21._8_8_ = 0x9ae16a3b2f904031;
    auVar21._0_8_ = 0x9ae16a3b2f904031;
    auVar24 = vpinsrq_avx(auVar21,lVar6,0);
    auVar19 = vpmullq_avx512vl(auVar22,auVar24);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = *(ulong *)(s + (len - 0x10));
    auVar26._8_8_ = 0;
    auVar26._0_8_ = *(ulong *)(s + 0x10);
    auVar22 = vpunpcklqdq_avx(auVar25,auVar26);
    auVar27._8_8_ = 0x9ae16a3b2f90404f;
    auVar27._0_8_ = 0x9ae16a3b2f90404f;
    auVar20 = vpmullq_avx512vl(auVar22,auVar27);
    auVar28._8_8_ = 0;
    auVar28._0_8_ = *(ulong *)(s + (len - 0x18));
    auVar29._8_8_ = 0;
    auVar29._0_8_ = *(ulong *)(s + 8);
    auVar23 = vpunpcklqdq_avx(auVar28,auVar29);
    auVar22 = vpaddq_avx(auVar18,auVar23);
    auVar21 = vprolq_avx512vl(auVar22,0x15);
    auVar22 = vprolq_avx512vl(auVar19,0x22);
    auVar22 = vpaddq_avx(auVar22,auVar20);
    auVar22 = vpaddq_avx(auVar22,auVar21);
    auVar23 = vpaddq_avx(auVar23,auVar27);
    auVar23 = vprolq_avx512vl(auVar23,0x2e);
    auVar23 = vpaddq_avx(auVar23,auVar19);
    auVar23 = vpaddq_avx(auVar23,auVar18);
    auVar22 = vpmullq_avx512vl(auVar22 ^ auVar23,auVar24);
    auVar18 = vpsrlq_avx(auVar22,0x2f);
    auVar22 = vpternlogq_avx512vl(auVar18,auVar23,auVar22,0x96);
    auVar22 = vpmullq_avx512vl(auVar22,auVar24);
    auVar23 = vpsrlq_avx(auVar22,0x2f);
    lVar3 = vpextrq_avx(auVar23 ^ auVar22,1);
    uVar7 = lVar3 + SUB168(auVar23 ^ auVar22,0) * lVar6;
  }
  return uVar7 * lVar6;
}

Assistant:

uint64_t farmhash64_xo(const char *s, size_t len) {
  if (len <= 32) {
    if (len <= 16) {
      return farmhash_na_len_0_to_16(s, len);
    } else {
      return farmhash_na_len_17_to_32(s, len);
    }
  } else if (len <= 64) {
    return farmhash_xo_len_33_to_64(s, len);
  } else if (len <= 96) {
    return farmhash_xo_len_65_to_96(s, len);
  } else if (len <= 256) {
    return farmhash64_na(s, len);
  } else {
    return farmhash64_uo(s, len);
  }
}